

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigrecord.hh
# Opt level: O2

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
* __thiscall
testgen::_bigrecord_Union__0__::get_map_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           *__return_storage_ptr__,_bigrecord_Union__0__ *this)

{
  Exception *this_00;
  any *in_RDX;
  allocator<char> local_39;
  string local_38;
  
  if (this->idx_ == 1) {
    boost::
    any_cast<std::map<std::__cxx11::string,int,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>>
              (__return_storage_ptr__,(boost *)&this->value_,in_RDX);
    return __return_storage_ptr__;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"Invalid type for union",&local_39);
  avro::Exception::Exception(this_00,&local_38);
  __cxa_throw(this_00,&avro::Exception::typeinfo,avro::Exception::~Exception);
}

Assistant:

inline
std::map<std::string, int32_t > _bigrecord_Union__0__::get_map() const {
    if (idx_ != 1) {
        throw avro::Exception("Invalid type for union");
    }
    return boost::any_cast<std::map<std::string, int32_t > >(value_);
}